

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaGetParserErrors
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaValidityErrorFunc *err,
              xmlSchemaValidityWarningFunc *warn,void **ctx)

{
  void **ctx_local;
  xmlSchemaValidityWarningFunc *warn_local;
  xmlSchemaValidityErrorFunc *err_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (err != (xmlSchemaValidityErrorFunc *)0x0) {
      *err = ctxt->error;
    }
    if (warn != (xmlSchemaValidityWarningFunc *)0x0) {
      *warn = ctxt->warning;
    }
    if (ctx != (void **)0x0) {
      *ctx = ctxt->errCtxt;
    }
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchemaGetParserErrors(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaValidityErrorFunc * err,
			 xmlSchemaValidityWarningFunc * warn, void **ctx)
{
	if (ctxt == NULL)
		return(-1);
	if (err != NULL)
		*err = ctxt->error;
	if (warn != NULL)
		*warn = ctxt->warning;
	if (ctx != NULL)
		*ctx = ctxt->errCtxt;
	return(0);
}